

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrInteractionProfileSuggestedBinding *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  string *prefix_00;
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  XrActionSuggestedBinding *pXVar2;
  bool bVar3;
  XrInstance pXVar4;
  ostream *poVar5;
  invalid_argument *piVar6;
  ulong uVar7;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  long local_480;
  string suggestedbindings_prefix;
  string type_prefix;
  string suggestedbindings_array_prefix;
  string countsuggestedbindings_prefix;
  string interactionprofile_prefix;
  string next_prefix;
  string local_3a8;
  undefined1 local_388 [64];
  string local_348;
  ostringstream oss_countSuggestedBindings;
  ostringstream oss_suggestedBindings_array;
  uint auStack_190 [88];
  
  PointerToHexString<XrInteractionProfileSuggestedBinding>(value);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_countSuggestedBindings);
  std::__cxx11::string::~string((string *)&oss_countSuggestedBindings);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_countSuggestedBindings,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_countSuggestedBindings);
    std::__cxx11::string::~string((string *)&oss_countSuggestedBindings);
  }
  else {
    _oss_countSuggestedBindings = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar4 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar4,value->type,(char *)&oss_countSuggestedBindings);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_countSuggestedBindings);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_3a8,(string *)&next_prefix);
  bVar3 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_3a8,contents);
  std::__cxx11::string::~string((string *)&local_3a8);
  if (bVar3) {
    std::__cxx11::string::string((string *)&interactionprofile_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&interactionprofile_prefix);
    std::__cxx11::to_string((string *)&oss_countSuggestedBindings,value->interactionProfile);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [7])"XrPath",&interactionprofile_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_countSuggestedBindings);
    std::__cxx11::string::~string((string *)&oss_countSuggestedBindings);
    std::__cxx11::string::string((string *)&countsuggestedbindings_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&countsuggestedbindings_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_countSuggestedBindings);
    poVar5 = std::operator<<((ostream *)&oss_countSuggestedBindings,"0x");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&countsuggestedbindings_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_suggestedBindings_array);
    std::__cxx11::string::~string((string *)&oss_suggestedBindings_array);
    std::__cxx11::string::string((string *)&suggestedbindings_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&suggestedbindings_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_suggestedBindings_array);
    *(uint *)((long)auStack_190 + *(long *)(_oss_suggestedBindings_array + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_oss_suggestedBindings_array + -0x18)) & 0xffffffb5
         | 8;
    std::ostream::_M_insert<void_const*>(&oss_suggestedBindings_array);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[32],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [32])"const XrActionSuggestedBinding*",
               &suggestedbindings_prefix,&suggestedbindings_array_prefix);
    std::__cxx11::string::~string((string *)&suggestedbindings_array_prefix);
    local_480 = 0;
    prefix_00 = (string *)(local_388 + 0x20);
    uVar7 = 0;
    while( true ) {
      if (value->countSuggestedBindings <= uVar7) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_suggestedBindings_array);
        std::__cxx11::string::~string((string *)&suggestedbindings_prefix);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_countSuggestedBindings);
        std::__cxx11::string::~string((string *)&countsuggestedbindings_prefix);
        std::__cxx11::string::~string((string *)&interactionprofile_prefix);
        std::__cxx11::string::~string((string *)&next_prefix);
        std::__cxx11::string::~string((string *)&type_prefix);
        return true;
      }
      std::__cxx11::string::string
                ((string *)&suggestedbindings_array_prefix,(string *)&suggestedbindings_prefix);
      std::__cxx11::string::append((char *)&suggestedbindings_array_prefix);
      std::__cxx11::to_string(&local_348,(uint)uVar7);
      std::__cxx11::string::append((string *)&suggestedbindings_array_prefix);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::append((char *)&suggestedbindings_array_prefix);
      pXVar2 = value->suggestedBindings;
      std::__cxx11::string::string((string *)prefix_00,(string *)&suggestedbindings_array_prefix);
      gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_388;
      std::__cxx11::string::string
                ((string *)local_388,"const XrActionSuggestedBinding*",(allocator *)&local_348);
      bVar3 = ApiDumpOutputXrStruct
                        (gen_dispatch_table_00,
                         (XrActionSuggestedBinding *)((long)&pXVar2->action + local_480),prefix_00,
                         (string *)local_388,false,contents);
      std::__cxx11::string::~string((string *)local_388);
      std::__cxx11::string::~string((string *)prefix_00);
      if (!bVar3) break;
      std::__cxx11::string::~string((string *)&suggestedbindings_array_prefix);
      uVar7 = uVar7 + 1;
      local_480 = local_480 + 0x10;
    }
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Invalid Operation");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar6,"Invalid Operation");
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrInteractionProfileSuggestedBinding* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string interactionprofile_prefix = prefix;
        interactionprofile_prefix += "interactionProfile";
        contents.emplace_back("XrPath", interactionprofile_prefix, std::to_string(value->interactionProfile));
        std::string countsuggestedbindings_prefix = prefix;
        countsuggestedbindings_prefix += "countSuggestedBindings";
        std::ostringstream oss_countSuggestedBindings;
        oss_countSuggestedBindings << "0x" << std::hex << (value->countSuggestedBindings);
        contents.emplace_back("uint32_t", countsuggestedbindings_prefix, oss_countSuggestedBindings.str());
        std::string suggestedbindings_prefix = prefix;
        suggestedbindings_prefix += "suggestedBindings";
        std::ostringstream oss_suggestedBindings_array;
        oss_suggestedBindings_array << std::hex << reinterpret_cast<const void*>(value->suggestedBindings);
        contents.emplace_back("const XrActionSuggestedBinding*", suggestedbindings_prefix, oss_suggestedBindings_array.str());
        for (uint32_t value_suggestedbindings_inc = 0; value_suggestedbindings_inc < value->countSuggestedBindings; ++value_suggestedbindings_inc) {
            std::string suggestedbindings_array_prefix = suggestedbindings_prefix;
            suggestedbindings_array_prefix += "[";
            suggestedbindings_array_prefix += std::to_string(value_suggestedbindings_inc);
            suggestedbindings_array_prefix += "]";
            if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->suggestedBindings[value_suggestedbindings_inc], suggestedbindings_array_prefix, "const XrActionSuggestedBinding*", false, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        return true;
    } catch(...) {
    }
    return false;
}